

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O3

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefAST *node_,
          BitSet *set_,bool matchNot)

{
  ASTRef *pAVar1;
  AST *pAVar2;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Mismatched Token","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"<AST>","");
  RecognitionException::RecognitionException
            (&this->super_RecognitionException,&local_50,&local_70,-1,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->super_RecognitionException).super_ANTLRException._vptr_ANTLRException =
       (_func_int **)&PTR__MismatchedTokenException_0024ed48;
  (this->token).ref = (TokenRef *)0x0;
  pAVar1 = node_->ref;
  if (pAVar1 != (ASTRef *)0x0) {
    pAVar1->count = pAVar1->count + 1;
  }
  (this->node).ref = pAVar1;
  if ((node_->ref == (ASTRef *)0x0) || (pAVar2 = node_->ref->ptr, pAVar2 == (AST *)0x0)) {
    (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&this->tokenText,"<empty tree>","");
  }
  else {
    (*pAVar2->_vptr_AST[0x18])();
  }
  this->mismatchType = matchNot + 5;
  std::vector<bool,_std::allocator<bool>_>::vector(&(this->set).storage,&set_->storage);
  this->tokenNames = tokenNames_;
  this->numTokens = numTokens_;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefAST node_,
	BitSet set_,
	bool matchNot
) : RecognitionException("Mismatched Token","<AST>",-1,-1)
  , token(0)
  , node(node_)
  , tokenText( (node_ ? node_->toString(): ANTLR_USE_NAMESPACE(std)string("<empty tree>")) )
  , mismatchType(matchNot ? NOT_SET : SET)
  , set(set_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}